

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

GLValue deqp::gls::anon_unknown_1::GLValue::getMaxValue(InputType type)

{
  long lVar1;
  GLValue GVar2;
  uint local_c8 [2];
  anon_union_8_10_1f5805e9_for_GLValue_1 local_c0;
  undefined4 local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined1 local_90;
  undefined4 local_88;
  undefined2 local_80;
  undefined4 local_78;
  undefined1 local_70;
  undefined4 local_68;
  undefined2 local_60;
  undefined4 local_58;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 local_40;
  undefined4 local_38;
  deFloat16 local_30;
  
  lVar1 = 0;
  do {
    *(undefined4 *)((long)local_c8 + lVar1) = 0xc;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xc0);
  local_c8[0] = 0;
  local_c0.fl.m_value = (Float)127.0;
  local_a8 = 2;
  local_a0 = 0x405fc00000000000;
  local_98 = 3;
  local_90 = 0x7f;
  local_78 = 5;
  local_70 = 0xff;
  local_68 = 6;
  local_60 = 0xfffa;
  local_88 = 4;
  local_80 = 0x7ff8;
  local_b8 = 1;
  local_b0 = 0x7ff8;
  local_58 = 7;
  local_50 = 0x7fffffff;
  local_48 = 8;
  local_40 = 0xffffffff;
  local_30 = (deFloat16)Half::create(256.0);
  local_38 = 9;
  GVar2._4_4_ = 0;
  GVar2.type = local_c8[(long)(int)type * 4];
  GVar2.field_1 = (&local_c0)[(long)(int)type * 2];
  return GVar2;
}

Assistant:

GLValue GLValue::getMaxValue (DrawTestSpec::InputType type)
{
	GLValue rangesHi[(int)DrawTestSpec::INPUTTYPE_LAST];

	rangesHi[(int)DrawTestSpec::INPUTTYPE_FLOAT]			= GLValue(Float::create(127.0f));
	rangesHi[(int)DrawTestSpec::INPUTTYPE_DOUBLE]			= GLValue(Double::create(127.0f));
	rangesHi[(int)DrawTestSpec::INPUTTYPE_BYTE]				= GLValue(Byte::create(127));
	rangesHi[(int)DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE]	= GLValue(Ubyte::create(255));
	rangesHi[(int)DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT]	= GLValue(Ushort::create(65530));
	rangesHi[(int)DrawTestSpec::INPUTTYPE_SHORT]			= GLValue(Short::create(32760));
	rangesHi[(int)DrawTestSpec::INPUTTYPE_FIXED]			= GLValue(Fixed::create(32760));
	rangesHi[(int)DrawTestSpec::INPUTTYPE_INT]				= GLValue(Int::create(2147483647));
	rangesHi[(int)DrawTestSpec::INPUTTYPE_UNSIGNED_INT]		= GLValue(Uint::create(4294967295u));
	rangesHi[(int)DrawTestSpec::INPUTTYPE_HALF]				= GLValue(Half::create(256.0f));

	return rangesHi[(int)type];
}